

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O3

JL_STATUS ProcessDictionaryOnStack
                    (ProcessStack *Stack,uint32_t *pStackDepth,JlBuffer *JsonBuffer,
                    JL_OUTPUT_FLAGS OutputFlags)

{
  ProcessStack *pPVar1;
  uint32_t uVar2;
  ProcessStack *pPVar3;
  JL_STATUS JVar4;
  uint uVar5;
  JL_DATA_TYPE JVar6;
  char *nextObjectKey;
  JlDataObject *nextObject;
  char *local_40;
  JlDataObject *local_38;
  
  pPVar1 = Stack + *pStackDepth;
  if (pPVar1->StartedEnumerating == false) {
    JVar4 = OutputDictionaryStart(JsonBuffer,OutputFlags,*pStackDepth);
    pPVar1->StartedEnumerating = true;
    (pPVar1->field_4).ListEnumerator = (JlListItem *)0x0;
    if (JVar4 != JL_STATUS_SUCCESS) {
      return JVar4;
    }
  }
  local_38 = (JlDataObject *)0x0;
  local_40 = (char *)0x0;
  JVar4 = JlGetObjectDictionaryNextItem
                    (pPVar1->Object,&local_38,&local_40,&(pPVar1->field_4).DictionaryEnumerator);
  if (JVar4 == JL_STATUS_END_OF_DATA) {
    if (((OutputFlags & 0x10) != 0) && (pPVar1->ProcessedFirstItem == true)) {
      JlBufferAdd(JsonBuffer,",",1);
    }
    JVar4 = OutputDictionaryEnd(JsonBuffer,OutputFlags,*pStackDepth);
    *pStackDepth = *pStackDepth - 1;
  }
  else if (JVar4 == JL_STATUS_SUCCESS) {
    uVar5 = *pStackDepth + 1;
    pPVar3 = Stack + uVar5;
    pPVar3->ObjectType = JL_DATA_TYPE_NONE;
    pPVar3->StartedEnumerating = false;
    pPVar3->ProcessedFirstItem = false;
    *(undefined2 *)&pPVar3->field_0xe = 0;
    ((anon_union_8_2_15b94429_for_ProcessStack_4 *)(&pPVar3->ObjectType + 2))->ListEnumerator =
         (JlListItem *)0x0;
    Stack[uVar5].Object = local_38;
    JVar6 = JlGetObjectType(local_38);
    Stack[uVar5].ObjectType = JVar6;
    uVar2 = *pStackDepth;
    *pStackDepth = uVar2 + 1;
    if (pPVar1->ProcessedFirstItem == false) {
      pPVar1->ProcessedFirstItem = true;
    }
    else {
      JVar4 = OutputDictionaryBetween(JsonBuffer,OutputFlags,uVar2 + 1);
      pPVar1->ProcessedFirstItem = true;
      if (JVar4 != JL_STATUS_SUCCESS) {
        return JVar4;
      }
    }
    JVar4 = OutputDictionaryKey(local_40,JsonBuffer,OutputFlags);
  }
  return JVar4;
}

Assistant:

JL_STATUS
    ProcessDictionaryOnStack
    (
        ProcessStack*       Stack,
        uint32_t*           pStackDepth,
        JlBuffer*           JsonBuffer,
        JL_OUTPUT_FLAGS     OutputFlags
    )
{
    JL_STATUS jlStatus;
    ProcessStack* currentItem = &Stack[*pStackDepth];

    jlStatus = JL_STATUS_SUCCESS;

    if( !currentItem->StartedEnumerating )
    {
        // Start a dictionary
        jlStatus = OutputDictionaryStart( JsonBuffer, OutputFlags, *pStackDepth );
        currentItem->StartedEnumerating = true;
        currentItem->DictionaryEnumerator = NULL;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Add next dictionary item to stack
        JlDataObject* nextObject = NULL;
        char const* nextObjectKey = NULL;
        jlStatus = JlGetObjectDictionaryNextItem( currentItem->Object, &nextObject, &nextObjectKey, &currentItem->DictionaryEnumerator );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Add item to stack
            ProcessStack* newItem = &Stack[*pStackDepth+1];
            memset( newItem, 0, sizeof(ProcessStack) );
            newItem->Object = nextObject;
            newItem->ObjectType = JlGetObjectType( nextObject );
            *pStackDepth += 1;

            if( currentItem->ProcessedFirstItem )
            {
                // Need to add a comma.
                jlStatus = OutputDictionaryBetween( JsonBuffer, OutputFlags, *pStackDepth );
            }
            currentItem->ProcessedFirstItem = true;

            // Output Key name
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = OutputDictionaryKey( nextObjectKey, JsonBuffer, OutputFlags );
            }
        }
        else if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // End list
            if( OutputFlags & JL_OUTPUT_FLAGS_J5_TRAILING_COMMAS && currentItem->ProcessedFirstItem )
            {
                // Add trailing comma
                (void) JlBufferAdd( JsonBuffer, ",", 1 );
            }
            jlStatus = OutputDictionaryEnd( JsonBuffer, OutputFlags, *pStackDepth );
            *pStackDepth -=1;
        }
    }

    return jlStatus;
}